

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

void __thiscall CVmBifTable::CVmBifTable(CVmBifTable *this,size_t init_entries)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI == 0) {
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  else {
    pvVar1 = malloc(in_RSI << 3);
    *in_RDI = pvVar1;
    pvVar1 = malloc(in_RSI << 3);
    in_RDI[1] = pvVar1;
  }
  *(undefined2 *)(in_RDI + 2) = 0;
  in_RDI[3] = in_RSI;
  return;
}

Assistant:

CVmBifTable::CVmBifTable(size_t init_entries)
{
    /* allocate space for our entries */
    if (init_entries != 0)
    {
        /* allocate the space */
        table_ = (vm_bif_entry_t **)
                 t3malloc(init_entries * sizeof(table_[0]));
        names_ = (char **)
                 t3malloc(init_entries * sizeof(names_[0]));
    }
    else
    {
        /* we have no entries */
        table_ = 0;
        names_ = 0;
    }

    /* no entries are defined yet */
    count_ = 0;

    /* remember the allocation size */
    alloc_ = init_entries;
}